

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_35(QPDF *pdf,char *arg2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  char cVar7;
  char cVar8;
  int iVar9;
  mapped_type *pmVar10;
  long lVar11;
  long lVar12;
  size_type sVar13;
  long *plVar14;
  ostream *poVar15;
  _Base_ptr p_Var16;
  undefined8 uVar17;
  long *plVar18;
  ulong uVar19;
  int iVar20;
  string t;
  string filename;
  QPDFObjectHandle names;
  QPDFObjectHandle item;
  QPDFObjectHandle stream;
  QPDFObjectHandle embeddedFiles;
  QPDFObjectHandle root;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
  attachments;
  long *local_270 [2];
  long local_260 [2];
  long *local_250;
  element_type *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_240;
  element_type local_238;
  undefined7 uStack_237;
  long *local_228;
  key_type local_220;
  long *local_200;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  long *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  long local_198;
  long lStack_190;
  long *local_188 [2];
  long local_178 [2];
  long *local_168 [2];
  long local_158 [2];
  long *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  long local_138 [2];
  long *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  long local_118 [2];
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8;
  string local_e0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  string local_d0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  string local_c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  string local_b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  string local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  string local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDF::getRoot();
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"/Names","");
  QPDFObjectHandle::getKey((string *)&local_1b8);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"/EmbeddedFiles","");
  QPDFObjectHandle::getKey(local_b0);
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"/Names","");
  QPDFObjectHandle::getKey((string *)&local_148);
  p_Var6 = p_Stack_140;
  local_1b8 = local_148;
  p_Var1 = p_Stack_1b0;
  local_148 = (long *)0x0;
  p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_1b0 = p_Var6;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  local_250 = local_1c8;
  local_228 = local_178;
  local_1e0 = local_158;
  local_e8 = local_f8;
  iVar20 = 0;
  do {
    iVar9 = QPDFObjectHandle::getArrayNItems();
    if (iVar9 <= iVar20) {
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header) {
        p_Var16 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          lVar11 = Buffer::getBuffer();
          lVar12 = Buffer::getSize();
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_220,lVar11,lVar12 + lVar11);
          if (local_220._M_string_length != 0) {
            uVar19 = 0;
LAB_0012036d:
            if ((byte)local_220._M_dataplus._M_p[uVar19] < 0x7f) goto code_r0x00120373;
            local_248 = &local_238;
            p_Stack_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_238 = (element_type)0x0;
            if (local_220._M_string_length != 0) {
              uVar19 = 0;
              do {
                if (local_220._M_string_length <= uVar19) {
                  uVar17 = std::__throw_out_of_range_fmt
                                     ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                      ,uVar19);
                  if (local_270[0] != local_260) {
                    operator_delete(local_270[0],local_260[0] + 1);
                  }
                  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
                  }
                  if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
                  }
                  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
                  }
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
                  ::~_Rb_tree(&local_60);
                  _Unwind_Resume(uVar17);
                }
                if ((byte)(local_220._M_dataplus._M_p[uVar19] + 0x81U) < 0xa1) {
                  std::__cxx11::string::append((char *)&local_248);
                }
                else {
                  std::__cxx11::string::push_back((char)&local_248);
                }
                uVar19 = uVar19 + 1;
                sVar13 = local_220._M_string_length;
                if (0x13 < local_220._M_string_length) {
                  sVar13 = 0x14;
                }
              } while (uVar19 < sVar13);
            }
            QUtil::uint_to_string_abi_cxx11_((ulonglong)&local_128,(int)local_220._M_string_length);
            plVar14 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_128,0,(char *)0x0,0x148c8f);
            local_1a8 = &local_198;
            plVar18 = plVar14 + 2;
            if ((long *)*plVar14 == plVar18) {
              local_198 = *plVar18;
              lStack_190 = plVar14[3];
            }
            else {
              local_198 = *plVar18;
              local_1a8 = (long *)*plVar14;
            }
            local_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
            *plVar14 = (long)plVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_1a8);
            local_200 = &local_1f0;
            plVar18 = plVar14 + 2;
            if ((long *)*plVar14 == plVar18) {
              local_1f0 = *plVar18;
              lStack_1e8 = plVar14[3];
            }
            else {
              local_1f0 = *plVar18;
              local_200 = (long *)*plVar14;
            }
            local_1f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
            *plVar14 = (long)plVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_200);
            if (local_200 != &local_1f0) {
              operator_delete(local_200,local_1f0 + 1);
            }
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8,local_198 + 1);
            }
            if (local_128 != local_118) {
              operator_delete(local_128,local_118[0] + 1);
            }
            std::__cxx11::string::_M_assign((string *)&local_220);
            if (local_248 != &local_238) {
              operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
            }
          }
LAB_0012057f:
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,*(char **)(p_Var16 + 1),
                               (long)p_Var16[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,":\n",2);
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,local_220._M_dataplus._M_p,local_220._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"--END--\n",8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
        } while ((_Rb_tree_header *)p_Var16 != &local_60._M_impl.super__Rb_tree_header);
      }
      if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
      }
      if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
      }
      if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    QPDFObjectHandle::getArrayItem((int)&local_1a8);
    cVar7 = QPDFObjectHandle::isDictionary();
    if (cVar7 == '\0') {
LAB_0011fec1:
      bVar4 = false;
LAB_0011fec4:
      bVar3 = false;
LAB_0011fec9:
      bVar2 = false;
      cVar8 = '\0';
    }
    else {
      local_270[0] = local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"/Type","");
      QPDFObjectHandle::getKey(local_c0);
      cVar8 = QPDFObjectHandle::isName();
      if (cVar8 == '\0') goto LAB_0011fec1;
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"/Type","");
      QPDFObjectHandle::getKey(local_70);
      QPDFObjectHandle::getName_abi_cxx11_();
      iVar9 = std::__cxx11::string::compare((char *)&local_148);
      if (iVar9 != 0) {
        bVar4 = true;
        goto LAB_0011fec4;
      }
      local_188[0] = local_178;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"/EF","");
      QPDFObjectHandle::getKey(local_80);
      cVar8 = QPDFObjectHandle::isDictionary();
      if (cVar8 == '\0') {
        bVar4 = true;
        bVar3 = true;
        goto LAB_0011fec9;
      }
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"/EF","");
      QPDFObjectHandle::getKey(local_d0);
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"/F","");
      QPDFObjectHandle::getKey(local_90);
      cVar8 = QPDFObjectHandle::isStream();
      bVar4 = true;
      bVar3 = true;
      bVar2 = true;
    }
    if (bVar2) {
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0],local_f8[0] + 1);
      }
      if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
      }
      if (local_168[0] != local_158) {
        operator_delete(local_168[0],local_158[0] + 1);
      }
    }
    if (bVar3) {
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if (local_188[0] != local_178) {
        operator_delete(local_188[0],local_178[0] + 1);
      }
    }
    if (bVar4) {
      if (local_148 != local_138) {
        operator_delete(local_148,local_138[0] + 1);
      }
      if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
    }
    if (cVar7 != '\0') {
      if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
      }
      if (local_270[0] != local_260) {
        operator_delete(local_270[0],local_260[0] + 1);
      }
    }
    if (cVar8 != '\0') {
      local_248 = &local_238;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/F","");
      QPDFObjectHandle::getKey((string *)&local_200);
      QPDFObjectHandle::getStringValue_abi_cxx11_();
      if (local_1f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
      }
      local_248 = &local_238;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/EF","");
      QPDFObjectHandle::getKey(local_e0);
      local_200 = &local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"/F","");
      QPDFObjectHandle::getKey((string *)&local_128);
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
      }
      QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)(string *)&local_248);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
                              *)&local_60,&local_220);
      p_Var6 = p_Stack_240;
      peVar5 = local_248;
      local_248 = (element_type *)0x0;
      p_Stack_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (pmVar10->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (pmVar10->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar5;
      (pmVar10->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var6;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if (p_Stack_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_240);
      }
      if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
    }
    iVar20 = iVar20 + 1;
  } while( true );
code_r0x00120373:
  uVar19 = uVar19 + 1;
  if (local_220._M_string_length == uVar19) goto LAB_0012057f;
  goto LAB_0012036d;
}

Assistant:

static void
test_35(QPDF& pdf, char const* arg2)
{
    // Extract attachments

    std::map<std::string, std::shared_ptr<Buffer>> attachments;
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle names = root.getKey("/Names");
    QPDFObjectHandle embeddedFiles = names.getKey("/EmbeddedFiles");
    names = embeddedFiles.getKey("/Names");
    for (int i = 0; i < names.getArrayNItems(); ++i) {
        QPDFObjectHandle item = names.getArrayItem(i);
        if (item.isDictionary() && item.getKey("/Type").isName() &&
            (item.getKey("/Type").getName() == "/Filespec") && item.getKey("/EF").isDictionary() &&
            item.getKey("/EF").getKey("/F").isStream()) {
            std::string filename = item.getKey("/F").getStringValue();
            QPDFObjectHandle stream = item.getKey("/EF").getKey("/F");
            attachments[filename] = stream.getStreamData();
        }
    }
    for (auto const& iter: attachments) {
        std::string const& filename = iter.first;
        std::string data = std::string(
            reinterpret_cast<char const*>(iter.second->getBuffer()), iter.second->getSize());
        bool is_binary = false;
        for (size_t i = 0; i < data.size(); ++i) {
            if ((data.at(i) < 0) || (data.at(i) > 126)) {
                is_binary = true;
                break;
            }
        }
        if (is_binary) {
            std::string t;
            for (size_t i = 0; i < std::min(data.size(), QIntC::to_size(20)); ++i) {
                if ((data.at(i) >= 32) && (data.at(i) <= 126)) {
                    t += data.at(i);
                } else {
                    t += ".";
                }
            }
            t += " (" + QUtil::uint_to_string(data.size()) + " bytes)";
            data = t;
        }
        std::cout << filename << ":\n" << data << "--END--\n";
    }
}